

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O0

void __thiscall LinkInfo::parseDriveType(LinkInfo *this)

{
  reference pvVar1;
  ostream *poVar2;
  LinkInfo *this_local;
  
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_UNKNOWN");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive type cannot be determined.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_NO_ROOT_DIR");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The root path is invalid; for example, there is no volume mounted at the path."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_REMOVABLE");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The drive has removable media, such as a floppy drive, thumb drive, or flash card reader."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_FIXED");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The drive has fixed media, such as a hard drive or flash drive.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_REMOTE");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive is a remote (network) drive.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_CDROM");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive is a CD-ROM drive.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&(this->VolumeID).DriveType,3);
  if (*pvVar1 == 6) {
    poVar2 = std::operator<<((ostream *)&std::cout,"DRIVE_RAMDISK");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"The drive is a RAM disk.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void LinkInfo::parseDriveType() {
    if (VolumeID.DriveType[3] == DRIVE_UNKNOWN)
        cout << "DRIVE_UNKNOWN" << endl << Utils::defaultOffsetDocInfo <<
            "The drive type cannot be determined." << endl;
    if (VolumeID.DriveType[3] == DRIVE_NO_ROOT_DIR)
        cout << "DRIVE_NO_ROOT_DIR" << endl << Utils::defaultOffsetDocInfo <<
            "The root path is invalid; for example, there is no volume mounted at the path." << endl;
    if (VolumeID.DriveType[3] == DRIVE_REMOVABLE)
        cout << "DRIVE_REMOVABLE" << endl << Utils::defaultOffsetDocInfo <<
            "The drive has removable media, such as a floppy drive, thumb drive, or flash card reader." << endl;
    if (VolumeID.DriveType[3] == DRIVE_FIXED)
        cout << "DRIVE_FIXED" << endl << Utils::defaultOffsetDocInfo <<
            "The drive has fixed media, such as a hard drive or flash drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_REMOTE)
        cout << "DRIVE_REMOTE" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a remote (network) drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_CDROM)
        cout << "DRIVE_CDROM" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a CD-ROM drive." << endl;
    if (VolumeID.DriveType[3] == DRIVE_RAMDISK)
        cout << "DRIVE_RAMDISK" << endl << Utils::defaultOffsetDocInfo <<
            "The drive is a RAM disk." << endl;
}